

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgsequ.c
# Opt level: O1

void cgsequ(SuperMatrix *A,float *r,float *c,float *rowcnd,float *colcnd,float *amax,int *info)

{
  void *pvVar1;
  long lVar2;
  uint uVar3;
  int iVar4;
  long lVar5;
  ulong uVar6;
  long lVar7;
  singlecomplex *psVar8;
  long lVar9;
  float fVar10;
  double dVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  int ii;
  int local_34;
  
  *info = 0;
  if ((((A->nrow < 0) || (A->ncol < 0)) || (A->Stype != SLU_NC)) ||
     ((A->Dtype != SLU_C || (A->Mtype != SLU_GE)))) {
    *info = -1;
  }
  if (*info == 0) {
    if ((A->nrow == 0) || (A->ncol == 0)) {
      *rowcnd = 1.0;
      *colcnd = 1.0;
      *amax = 0.0;
    }
    else {
      pvVar1 = A->Store;
      lVar2 = *(long *)((long)pvVar1 + 8);
      fVar10 = smach("S");
      if (0 < (long)A->nrow) {
        memset(r,0,(long)A->nrow << 2);
      }
      uVar3 = A->ncol;
      if (0 < (int)uVar3) {
        lVar5 = 0;
        do {
          iVar4 = *(int *)(*(long *)((long)pvVar1 + 0x18) + lVar5 * 4);
          lVar7 = (long)iVar4;
          lVar9 = lVar5 + 1;
          if (iVar4 < *(int *)(*(long *)((long)pvVar1 + 0x18) + 4 + lVar5 * 4)) {
            psVar8 = (singlecomplex *)(lVar2 + lVar7 * 8);
            do {
              iVar4 = *(int *)(*(long *)((long)pvVar1 + 0x10) + lVar7 * 4);
              fVar14 = r[iVar4];
              dVar11 = c_abs1(psVar8);
              if ((double)fVar14 <= dVar11) {
                dVar11 = c_abs1(psVar8);
                fVar14 = (float)dVar11;
              }
              else {
                fVar14 = r[iVar4];
              }
              r[iVar4] = fVar14;
              lVar7 = lVar7 + 1;
              psVar8 = psVar8 + 1;
            } while (lVar7 < *(int *)(*(long *)((long)pvVar1 + 0x18) + lVar9 * 4));
          }
          uVar3 = A->ncol;
          lVar5 = lVar9;
        } while (lVar9 < (int)uVar3);
      }
      fVar15 = 1.0 / fVar10;
      iVar4 = A->nrow;
      lVar5 = (long)iVar4;
      fVar14 = 0.0;
      fVar12 = fVar15;
      if (0 < lVar5) {
        lVar7 = 0;
        do {
          fVar13 = r[lVar7];
          if (fVar14 <= fVar13) {
            fVar14 = fVar13;
          }
          if (fVar13 <= fVar12) {
            fVar12 = fVar13;
          }
          lVar7 = lVar7 + 1;
        } while (lVar5 != lVar7);
      }
      *amax = fVar14;
      if ((fVar12 != 0.0) || (NAN(fVar12))) {
        if (0 < iVar4) {
          lVar7 = 0;
          do {
            fVar13 = r[lVar7];
            if (r[lVar7] <= fVar10) {
              fVar13 = fVar10;
            }
            if (fVar15 <= fVar13) {
              fVar13 = fVar15;
            }
            r[lVar7] = 1.0 / fVar13;
            lVar7 = lVar7 + 1;
          } while (lVar5 != lVar7);
        }
        if (fVar12 <= fVar10) {
          fVar12 = fVar10;
        }
        if (fVar15 <= fVar14) {
          fVar14 = fVar15;
        }
        *rowcnd = fVar12 / fVar14;
      }
      else if (0 < iVar4) {
        lVar7 = 0;
        do {
          if ((r[lVar7] == 0.0) && (!NAN(r[lVar7]))) {
            *info = (int)lVar7 + 1;
            return;
          }
          lVar7 = lVar7 + 1;
        } while (lVar5 != lVar7);
      }
      if (0 < (int)uVar3) {
        memset(c,0,(ulong)uVar3 << 2);
      }
      uVar3 = A->ncol;
      if (0 < (int)uVar3) {
        lVar5 = 0;
        do {
          iVar4 = *(int *)(*(long *)((long)pvVar1 + 0x18) + lVar5 * 4);
          lVar7 = (long)iVar4;
          lVar9 = lVar5 + 1;
          if (iVar4 < *(int *)(*(long *)((long)pvVar1 + 0x18) + 4 + lVar5 * 4)) {
            psVar8 = (singlecomplex *)(lVar2 + lVar7 * 8);
            do {
              iVar4 = *(int *)(*(long *)((long)pvVar1 + 0x10) + lVar7 * 4);
              fVar14 = c[lVar5];
              dVar11 = c_abs1(psVar8);
              if ((double)fVar14 <= (double)r[iVar4] * dVar11) {
                dVar11 = c_abs1(psVar8);
                fVar14 = (float)((double)r[iVar4] * dVar11);
              }
              else {
                fVar14 = c[lVar5];
              }
              c[lVar5] = fVar14;
              lVar7 = lVar7 + 1;
              psVar8 = psVar8 + 1;
            } while (lVar7 < *(int *)(*(long *)((long)pvVar1 + 0x18) + lVar9 * 4));
          }
          uVar3 = A->ncol;
          lVar5 = lVar9;
        } while (lVar9 < (int)uVar3);
      }
      fVar14 = 0.0;
      fVar12 = fVar15;
      if (0 < (int)uVar3) {
        uVar6 = 0;
        do {
          fVar13 = c[uVar6];
          if (fVar14 <= fVar13) {
            fVar14 = fVar13;
          }
          if (fVar13 <= fVar12) {
            fVar12 = fVar13;
          }
          uVar6 = uVar6 + 1;
        } while (uVar3 != uVar6);
      }
      if ((fVar12 != 0.0) || (NAN(fVar12))) {
        if (0 < (int)uVar3) {
          uVar6 = 0;
          do {
            fVar13 = c[uVar6];
            if (c[uVar6] <= fVar10) {
              fVar13 = fVar10;
            }
            if (fVar15 <= fVar13) {
              fVar13 = fVar15;
            }
            c[uVar6] = 1.0 / fVar13;
            uVar6 = uVar6 + 1;
          } while (uVar3 != uVar6);
        }
        if (fVar12 <= fVar10) {
          fVar12 = fVar10;
        }
        if (fVar15 <= fVar14) {
          fVar14 = fVar15;
        }
        *colcnd = fVar12 / fVar14;
      }
      else if (0 < (int)uVar3) {
        iVar4 = -1;
        uVar6 = 0;
        do {
          if ((c[uVar6] == 0.0) && (!NAN(c[uVar6]))) {
            *info = A->nrow - iVar4;
            return;
          }
          uVar6 = uVar6 + 1;
          iVar4 = iVar4 + -1;
        } while (uVar3 != uVar6);
      }
    }
  }
  else {
    local_34 = -*info;
    input_error("cgsequ",&local_34);
  }
  return;
}

Assistant:

void
cgsequ(SuperMatrix *A, float *r, float *c, float *rowcnd,
	float *colcnd, float *amax, int *info)
{


    /* Local variables */
    NCformat *Astore;
    singlecomplex   *Aval;
    int_t i, j;
    int   irow;
    float rcmin, rcmax;
    float bignum, smlnum;
    extern float smach(char *);
    
    /* Test the input parameters. */
    *info = 0;
    if ( A->nrow < 0 || A->ncol < 0 ||
	 A->Stype != SLU_NC || A->Dtype != SLU_C || A->Mtype != SLU_GE )
	*info = -1;
    if (*info != 0) {
	int ii = -(*info);
	input_error("cgsequ", &ii);
	return;
    }

    /* Quick return if possible */
    if ( A->nrow == 0 || A->ncol == 0 ) {
	*rowcnd = 1.;
	*colcnd = 1.;
	*amax = 0.;
	return;
    }

    Astore = A->Store;
    Aval = Astore->nzval;
    
    /* Get machine constants. */
    smlnum = smach("S");  /* slamch_("S"); */
    bignum = 1. / smlnum;

    /* Compute row scale factors. */
    for (i = 0; i < A->nrow; ++i) r[i] = 0.;

    /* Find the maximum element in each row. */
    for (j = 0; j < A->ncol; ++j)
	for (i = Astore->colptr[j]; i < Astore->colptr[j+1]; ++i) {
	    irow = Astore->rowind[i];
	    r[irow] = SUPERLU_MAX( r[irow], c_abs1(&Aval[i]) );
	}

    /* Find the maximum and minimum scale factors. */
    rcmin = bignum;
    rcmax = 0.;
    for (i = 0; i < A->nrow; ++i) {
	rcmax = SUPERLU_MAX(rcmax, r[i]);
	rcmin = SUPERLU_MIN(rcmin, r[i]);
    }
    *amax = rcmax;

    if (rcmin == 0.) {
	/* Find the first zero scale factor and return an error code. */
	for (i = 0; i < A->nrow; ++i)
	    if (r[i] == 0.) {
		*info = i + 1;
		return;
	    }
    } else {
	/* Invert the scale factors. */
	for (i = 0; i < A->nrow; ++i)
	    r[i] = 1. / SUPERLU_MIN( SUPERLU_MAX( r[i], smlnum ), bignum );
	/* Compute ROWCND = min(R(I)) / max(R(I)) */
	*rowcnd = SUPERLU_MAX( rcmin, smlnum ) / SUPERLU_MIN( rcmax, bignum );
    }

    /* Compute column scale factors */
    for (j = 0; j < A->ncol; ++j) c[j] = 0.;

    /* Find the maximum element in each column, assuming the row
       scalings computed above. */
    for (j = 0; j < A->ncol; ++j)
	for (i = Astore->colptr[j]; i < Astore->colptr[j+1]; ++i) {
	    irow = Astore->rowind[i];
	    c[j] = SUPERLU_MAX( c[j], c_abs1(&Aval[i]) * r[irow] );
	}

    /* Find the maximum and minimum scale factors. */
    rcmin = bignum;
    rcmax = 0.;
    for (j = 0; j < A->ncol; ++j) {
	rcmax = SUPERLU_MAX(rcmax, c[j]);
	rcmin = SUPERLU_MIN(rcmin, c[j]);
    }

    if (rcmin == 0.) {
	/* Find the first zero scale factor and return an error code. */
	for (j = 0; j < A->ncol; ++j)
	    if ( c[j] == 0. ) {
		*info = A->nrow + j + 1;
		return;
	    }
    } else {
	/* Invert the scale factors. */
	for (j = 0; j < A->ncol; ++j)
	    c[j] = 1. / SUPERLU_MIN( SUPERLU_MAX( c[j], smlnum ), bignum);
	/* Compute COLCND = min(C(J)) / max(C(J)) */
	*colcnd = SUPERLU_MAX( rcmin, smlnum ) / SUPERLU_MIN( rcmax, bignum );
    }

    return;

}